

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

Status __thiscall spvtools::opt::CopyPropagateArrays::Process(CopyPropagateArrays *this)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  Status SVar5;
  Module *this_00;
  reference this_01;
  Instruction *pIVar6;
  pointer pMVar7;
  undefined1 local_78 [8];
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source_object;
  Instruction *store_inst;
  iterator var_inst;
  BasicBlock *entry_bb;
  Function *function;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  bool modified;
  CopyPropagateArrays *this_local;
  
  bVar1 = false;
  this_00 = Pass::get_module((Pass *)this);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _function = Module::end(this_00);
  while (bVar2 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&function), bVar2)
  {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar2 = Function::IsDeclaration(this_01);
    if (!bVar2) {
      _var_inst = Function::begin(this_01);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&var_inst);
      BasicBlock::begin((BasicBlock *)&store_inst);
      while( true ) {
        pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)&store_inst);
        OVar3 = Instruction::opcode(pIVar6);
        if (OVar3 != OpVariable) break;
        pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)&store_inst);
        uVar4 = Instruction::type_id(pIVar6);
        bVar2 = IsPointerToArrayType(this,uVar4);
        if (bVar2) {
          pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)&store_inst);
          source_object._M_t.
          super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
          _M_head_impl = (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
                          )FindStoreInstruction(this,pIVar6);
          if ((tuple<spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
               )source_object._M_t.
                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                _M_head_impl !=
              (_Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>)0x0) {
            pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)&store_inst);
            FindSourceObjectIfPossible((CopyPropagateArrays *)local_78,(Instruction *)this,pIVar6);
            bVar2 = std::operator!=((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                     *)local_78,(nullptr_t)0x0);
            if (bVar2) {
              pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator*
                                 ((iterator_template<spvtools::opt::Instruction> *)&store_inst);
              pMVar7 = std::
                       unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                       ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                     *)local_78);
              uVar4 = MemoryObject::GetPointerTypeId(pMVar7,this);
              bVar2 = CanUpdateUses(this,pIVar6,uVar4);
              if (bVar2) {
                bVar1 = true;
                pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                         iterator_template<spvtools::opt::Instruction>::operator*
                                   ((iterator_template<spvtools::opt::Instruction> *)&store_inst);
                pMVar7 = std::
                         unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                         ::get((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                *)local_78);
                PropagateObject(this,pIVar6,pMVar7,
                                (Instruction *)
                                source_object._M_t.
                                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                ._M_head_impl);
              }
            }
            std::
            unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
            ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           *)local_78);
          }
        }
        InstructionList::iterator::operator++((iterator *)&store_inst);
      }
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar5 = SuccessWithoutChange;
  if (bVar1) {
    SVar5 = SuccessWithChange;
  }
  return SVar5;
}

Assistant:

Pass::Status CopyPropagateArrays::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    if (function.IsDeclaration()) {
      continue;
    }

    BasicBlock* entry_bb = &*function.begin();

    for (auto var_inst = entry_bb->begin();
         var_inst->opcode() == spv::Op::OpVariable; ++var_inst) {
      if (!IsPointerToArrayType(var_inst->type_id())) {
        continue;
      }

      // Find the only store to the entire memory location, if it exists.
      Instruction* store_inst = FindStoreInstruction(&*var_inst);

      if (!store_inst) {
        continue;
      }

      std::unique_ptr<MemoryObject> source_object =
          FindSourceObjectIfPossible(&*var_inst, store_inst);

      if (source_object != nullptr) {
        if (CanUpdateUses(&*var_inst, source_object->GetPointerTypeId(this))) {
          modified = true;
          PropagateObject(&*var_inst, source_object.get(), store_inst);
        }
      }
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}